

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O3

int WebPRescalerInit(WebPRescaler *rescaler,int src_width,int src_height,uint8_t *dst,int dst_width,
                    int dst_height,int dst_stride,int num_channels,rescaler_t *work)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  rescaler->x_expand = (uint)(src_width < dst_width);
  rescaler->y_expand = (uint)(src_height < dst_height);
  rescaler->src_width = src_width;
  rescaler->src_height = src_height;
  rescaler->dst_width = dst_width;
  rescaler->dst_height = dst_height;
  rescaler->src_y = 0;
  rescaler->dst_y = 0;
  rescaler->dst = dst;
  rescaler->dst_stride = dst_stride;
  rescaler->num_channels = num_channels;
  iVar6 = dst_width + -1;
  if (dst_width <= src_width) {
    iVar6 = src_width;
  }
  rescaler->x_add = iVar6;
  iVar5 = src_width + -1;
  if (dst_width <= src_width) {
    iVar5 = dst_width;
  }
  rescaler->x_sub = iVar5;
  if (dst_width <= src_width) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)dst_width;
    rescaler->fx_scale = SUB164((ZEXT416(0) << 0x40 | ZEXT816(0x100000000)) / auVar1,0);
  }
  iVar3 = src_height - (uint)(src_height < dst_height);
  iVar5 = dst_height - (uint)(src_height < dst_height);
  rescaler->y_add = iVar3;
  rescaler->y_sub = iVar5;
  if (src_height < dst_height) {
    rescaler->y_accum = iVar5;
    iVar5 = iVar6;
  }
  else {
    rescaler->y_accum = iVar3;
    uVar4 = ((ulong)(uint)dst_height << 0x20) / (ulong)((long)iVar3 * (long)iVar6);
    uVar7 = 0;
    if (uVar4 < 0x100000000) {
      uVar7 = uVar4;
    }
    rescaler->fxy_scale = (uint32_t)uVar7;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar5;
  rescaler->fy_scale = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100000000)) / auVar2,0);
  rescaler->irow = work;
  rescaler->frow = work + dst_width * num_channels;
  memset(work,0,(long)num_channels * (long)dst_width * 8);
  WebPRescalerDspInit();
  return 1;
}

Assistant:

int WebPRescalerInit(WebPRescaler* const rescaler,
                     int src_width, int src_height,
                     uint8_t* const dst,
                     int dst_width, int dst_height, int dst_stride,
                     int num_channels, rescaler_t* const work) {
  const int x_add = src_width, x_sub = dst_width;
  const int y_add = src_height, y_sub = dst_height;
  const uint64_t total_size = 2ull * dst_width * num_channels * sizeof(*work);
  if (!CheckSizeOverflow(total_size)) return 0;

  rescaler->x_expand = (src_width < dst_width);
  rescaler->y_expand = (src_height < dst_height);
  rescaler->src_width = src_width;
  rescaler->src_height = src_height;
  rescaler->dst_width = dst_width;
  rescaler->dst_height = dst_height;
  rescaler->src_y = 0;
  rescaler->dst_y = 0;
  rescaler->dst = dst;
  rescaler->dst_stride = dst_stride;
  rescaler->num_channels = num_channels;

  // for 'x_expand', we use bilinear interpolation
  rescaler->x_add = rescaler->x_expand ? (x_sub - 1) : x_add;
  rescaler->x_sub = rescaler->x_expand ? (x_add - 1) : x_sub;
  if (!rescaler->x_expand) {  // fx_scale is not used otherwise
    rescaler->fx_scale = WEBP_RESCALER_FRAC(1, rescaler->x_sub);
  }
  // vertical scaling parameters
  rescaler->y_add = rescaler->y_expand ? y_add - 1 : y_add;
  rescaler->y_sub = rescaler->y_expand ? y_sub - 1 : y_sub;
  rescaler->y_accum = rescaler->y_expand ? rescaler->y_sub : rescaler->y_add;
  if (!rescaler->y_expand) {
    // This is WEBP_RESCALER_FRAC(dst_height, x_add * y_add) without the cast.
    // Its value is <= WEBP_RESCALER_ONE, because dst_height <= rescaler->y_add
    // and rescaler->x_add >= 1;
    const uint64_t num = (uint64_t)dst_height * WEBP_RESCALER_ONE;
    const uint64_t den = (uint64_t)rescaler->x_add * rescaler->y_add;
    const uint64_t ratio = num / den;
    if (ratio != (uint32_t)ratio) {
      // When ratio == WEBP_RESCALER_ONE, we can't represent the ratio with the
      // current fixed-point precision. This happens when src_height ==
      // rescaler->y_add (which == src_height), and rescaler->x_add == 1.
      // => We special-case fxy_scale = 0, in WebPRescalerExportRow().
      rescaler->fxy_scale = 0;
    } else {
      rescaler->fxy_scale = (uint32_t)ratio;
    }
    rescaler->fy_scale = WEBP_RESCALER_FRAC(1, rescaler->y_sub);
  } else {
    rescaler->fy_scale = WEBP_RESCALER_FRAC(1, rescaler->x_add);
    // rescaler->fxy_scale is unused here.
  }
  rescaler->irow = work;
  rescaler->frow = work + num_channels * dst_width;
  memset(work, 0, (size_t)total_size);

  WebPRescalerDspInit();
  return 1;
}